

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

bool __thiscall wasm::RandomLattice::join(RandomLattice *this,Element *a,Element *b)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_tools_wasm_fuzz_lattices_cpp:969:5),_const_std::variant<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>_&,_std::variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>_&,_const_std::variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>_&>
  _Var1;
  type __variants;
  ElementImpl *__variants_1;
  ElementImpl *__variants_2;
  anon_class_1_0_00000001 local_21;
  Element *local_20;
  Element *b_local;
  Element *a_local;
  RandomLattice *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (Element *)this;
  __variants = std::
               unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
               ::operator*(&this->lattice);
  __variants_1 = RandomElement<wasm::RandomLattice>::operator*(b_local);
  __variants_2 = RandomElement<wasm::RandomLattice>::operator*(local_20);
  _Var1 = std::
          visit<wasm::RandomLattice::join(wasm::RandomElement<wasm::RandomLattice>&,wasm::RandomElement<wasm::RandomLattice>const&)const::__0,std::variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>const&,std::variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>&,std::variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>const&>
                    (&local_21,&__variants->super_LatticeVariant,
                     &__variants_1->super_LatticeElementVariant,
                     &__variants_2->super_LatticeElementVariant);
  return _Var1;
}

Assistant:

bool RandomLattice::join(Element& a, const Element& b) const noexcept {
  return std::visit(
    [](const auto& l, auto& elemA, const auto& elemB) -> bool {
      using ElemT = typename bare<decltype(l)>::Element;
      using A = bare<decltype(elemA)>;
      using B = bare<decltype(elemB)>;
      if constexpr (std::is_same_v<ElemT, A> && std::is_same_v<ElemT, B>) {
        return l.join(elemA, elemB);
      }
      WASM_UNREACHABLE("unexpected element types");
    },
    (const LatticeVariant&)*lattice,
    (LatticeElementVariant&)*a,
    (const LatticeElementVariant&)*b);
}